

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  int iVar1;
  stbi_uc *psVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  stbi_uc *psVar6;
  byte *pbVar7;
  uint uVar8;
  long in_FS_OFFSET;
  
  psVar6 = s->img_buffer;
  if (psVar6 < s->img_buffer_end) {
LAB_0011be93:
    psVar2 = psVar6 + 1;
    s->img_buffer = psVar2;
    if (*psVar6 == 'G') {
      if (s->img_buffer_end <= psVar2) {
        if (s->read_from_callbacks == 0) goto LAB_0011c0ba;
        stbi__refill_buffer(s);
        psVar2 = s->img_buffer;
      }
      psVar6 = psVar2 + 1;
      s->img_buffer = psVar6;
      if (*psVar2 == 'I') {
        if (s->img_buffer_end <= psVar6) {
          if (s->read_from_callbacks == 0) goto LAB_0011c0ba;
          stbi__refill_buffer(s);
          psVar6 = s->img_buffer;
        }
        psVar2 = psVar6 + 1;
        s->img_buffer = psVar2;
        if (*psVar6 == 'F') {
          if (s->img_buffer_end <= psVar2) {
            if (s->read_from_callbacks == 0) goto LAB_0011c0ba;
            stbi__refill_buffer(s);
            psVar2 = s->img_buffer;
          }
          psVar6 = psVar2 + 1;
          s->img_buffer = psVar6;
          if (*psVar2 == '8') {
            if (s->img_buffer_end <= psVar6) {
              if (s->read_from_callbacks == 0) goto LAB_0011c0ba;
              stbi__refill_buffer(s);
              psVar6 = s->img_buffer;
            }
            psVar2 = psVar6 + 1;
            s->img_buffer = psVar2;
            if ((*psVar6 == '7') || (*psVar6 == '9')) {
              if (s->img_buffer_end <= psVar2) {
                if (s->read_from_callbacks == 0) goto LAB_0011c0ba;
                stbi__refill_buffer(s);
                psVar2 = s->img_buffer;
              }
              s->img_buffer = psVar2 + 1;
              if (*psVar2 == 'a') {
                *(char **)(in_FS_OFFSET + -0x20) = "";
                iVar1 = stbi__get16le(s);
                g->w = iVar1;
                iVar1 = stbi__get16le(s);
                g->h = iVar1;
                pbVar3 = s->img_buffer;
                pbVar7 = s->img_buffer_end;
                if (pbVar3 < pbVar7) {
LAB_0011c01b:
                  s->img_buffer = pbVar3 + 1;
                  uVar8 = (uint)*pbVar3;
                  pbVar3 = pbVar3 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar3 = s->img_buffer;
                    pbVar7 = s->img_buffer_end;
                    goto LAB_0011c01b;
                  }
                  uVar8 = 0;
                }
                g->flags = uVar8;
                if (pbVar3 < pbVar7) {
LAB_0011c055:
                  s->img_buffer = pbVar3 + 1;
                  uVar8 = (uint)*pbVar3;
                  pbVar3 = pbVar3 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar3 = s->img_buffer;
                    pbVar7 = s->img_buffer_end;
                    goto LAB_0011c055;
                  }
                  uVar8 = 0;
                }
                g->bgindex = uVar8;
                if (pbVar3 < pbVar7) {
LAB_0011c088:
                  s->img_buffer = pbVar3 + 1;
                  uVar8 = (uint)*pbVar3;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar3 = s->img_buffer;
                    goto LAB_0011c088;
                  }
                  uVar8 = 0;
                }
                g->ratio = uVar8;
                g->transparent = -1;
                if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
                  if (comp != (int *)0x0) {
                    *comp = 4;
                  }
                  if (is_info != 0) {
                    return 1;
                  }
                  bVar5 = (byte)g->flags;
                  if (-1 < (char)bVar5) {
                    return 1;
                  }
                  stbi__gif_parse_colortable(s,g->pal,2 << (bVar5 & 7),-1);
                  return 1;
                }
                pcVar4 = "too large";
                goto LAB_0011c0c1;
              }
            }
          }
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar6 = s->img_buffer;
    goto LAB_0011be93;
  }
LAB_0011c0ba:
  pcVar4 = "not GIF";
LAB_0011c0c1:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar4;
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}